

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

void SUNDlsMat_denseGETRS(realtype **a,sunindextype n,sunindextype *p,realtype *b)

{
  realtype rVar1;
  realtype *prVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  uVar4 = 0;
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = p[uVar4];
    if (uVar4 != uVar3) {
      rVar1 = b[uVar4];
      b[uVar4] = b[(int)uVar3];
      b[(int)uVar3] = rVar1;
    }
  }
  uVar3 = n - 1;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  lVar6 = 1;
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    prVar2 = a[uVar4];
    for (lVar7 = lVar6; (int)lVar7 < n; lVar7 = lVar7 + 1) {
      b[lVar7] = b[lVar7] - prVar2[lVar7] * b[uVar4];
    }
    lVar6 = lVar6 + 1;
  }
  for (uVar4 = (ulong)uVar3; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    prVar2 = a[uVar4];
    b[uVar4] = b[uVar4] / prVar2[uVar4];
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      b[uVar5] = b[uVar5] - prVar2[uVar5] * b[uVar4];
    }
  }
  *b = *b / **a;
  return;
}

Assistant:

void SUNDlsMat_denseGETRS(realtype **a, sunindextype n, sunindextype *p, realtype *b)
{
  sunindextype i, k, pk;
  realtype *col_k, tmp;

  /* Permute b, based on pivot information in p */
  for (k=0; k<n; k++) {
    pk = p[k];
    if(pk != k) {
      tmp = b[k];
      b[k] = b[pk];
      b[pk] = tmp;
    }
  }

  /* Solve Ly = b, store solution y in b */
  for (k=0; k<n-1; k++) {
    col_k = a[k];
    for (i=k+1; i<n; i++) b[i] -= col_k[i]*b[k];
  }

  /* Solve Ux = y, store solution x in b */
  for (k = n-1; k > 0; k--) {
    col_k = a[k];
    b[k] /= col_k[k];
    for (i=0; i<k; i++) b[i] -= col_k[i]*b[k];
  }
  b[0] /= a[0][0];

}